

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall
slang::ast::Type::isValidForRand(Type *this,RandMode mode,LanguageVersion languageVersion)

{
  SymbolKind SVar1;
  bool bVar2;
  Type *pTVar3;
  long lVar4;
  
  while( true ) {
    pTVar3 = getCanonicalType(this);
    bVar2 = IntegralType::isKind((pTVar3->super_Symbol).kind);
    if ((bVar2) || (pTVar3 = getCanonicalType(this), (pTVar3->super_Symbol).kind == NullType)) {
      pTVar3 = getCanonicalType(this);
      SVar1 = (pTVar3->super_Symbol).kind;
      lVar4 = 0x8c;
      if (SVar1 != PackedUnionType) {
        if (SVar1 != UnpackedUnionType) {
          return true;
        }
        lVar4 = 0xa4;
      }
      if (*(char *)((long)&(pTVar3->super_Symbol).kind + lVar4) != '\x01') {
        return true;
      }
    }
    pTVar3 = getCanonicalType(this);
    if ((pTVar3->super_Symbol).kind == FloatingType) {
      return 0 < (int)languageVersion && mode == Rand;
    }
    pTVar3 = getCanonicalType(this);
    if (5 < (pTVar3->super_Symbol).kind - PackedArrayType) break;
    this = getArrayElementType(this);
  }
  pTVar3 = getCanonicalType(this);
  if (((pTVar3->super_Symbol).kind != ClassType) &&
     (pTVar3 = getCanonicalType(this), (pTVar3->super_Symbol).kind != UnpackedStructType)) {
    return false;
  }
  return mode == Rand;
}

Assistant:

bool Type::isValidForRand(RandMode mode, LanguageVersion languageVersion) const {
    if ((isIntegral() || isNull()) && !isTaggedUnion())
        return true;

    if (isFloating())
        return mode == RandMode::Rand && languageVersion >= LanguageVersion::v1800_2023;

    if (isArray())
        return getArrayElementType()->isValidForRand(mode, languageVersion);

    if (isClass() || isUnpackedStruct())
        return mode == RandMode::Rand;

    return false;
}